

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Promise<void> __thiscall
kj::Promise<void>::attach<kj::Own<kj::WebSocket>,kj::Own<kj::WebSocket>>
          (Promise<void> *this,Own<kj::WebSocket> *attachments,Own<kj::WebSocket> *attachments_1)

{
  WebSocket *pWVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long *in_RCX;
  AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::WebSocket>,_kj::Own<kj::WebSocket>_>_> *pAVar4;
  AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::WebSocket>,_kj::Own<kj::WebSocket>_>_>
  *extraout_RDX;
  AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::WebSocket>,_kj::Own<kj::WebSocket>_>_>
  *extraout_RDX_00;
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::WebSocket>,_kj::Own<kj::WebSocket>_>_>_>
  OVar5;
  Promise<void> PVar6;
  Tuple<kj::Own<kj::WebSocket>,_kj::Own<kj::WebSocket>_> local_38;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined8 uStack_10;
  
  local_38.impl.super_TupleElement<0U,_kj::Own<kj::WebSocket>_>.value.disposer =
       attachments_1->disposer;
  local_38.impl.super_TupleElement<0U,_kj::Own<kj::WebSocket>_>.value.ptr = attachments_1->ptr;
  attachments_1->ptr = (WebSocket *)0x0;
  local_38.impl.super_TupleElement<1U,_kj::Own<kj::WebSocket>_>.value.disposer = (Disposer *)*in_RCX
  ;
  local_38.impl.super_TupleElement<1U,_kj::Own<kj::WebSocket>_>.value.ptr = (WebSocket *)in_RCX[1];
  in_RCX[1] = 0;
  OVar5 = heap<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::WebSocket>,kj::Own<kj::WebSocket>>>,kj::Own<kj::_::PromiseNode>,kj::_::Tuple<kj::Own<kj::WebSocket>,kj::Own<kj::WebSocket>>>
                    ((kj *)&local_18,(Own<kj::_::PromiseNode> *)attachments,&local_38);
  pWVar1 = local_38.impl.super_TupleElement<1U,_kj::Own<kj::WebSocket>_>.value.ptr;
  pAVar4 = OVar5.ptr;
  uVar2 = (undefined4)uStack_10;
  uVar3 = uStack_10._4_4_;
  uStack_10 = 0;
  *(undefined4 *)&(this->super_PromiseBase).node.disposer = local_18;
  *(undefined4 *)((long)&(this->super_PromiseBase).node.disposer + 4) = uStack_14;
  *(undefined4 *)&(this->super_PromiseBase).node.ptr = uVar2;
  *(undefined4 *)((long)&(this->super_PromiseBase).node.ptr + 4) = uVar3;
  if (local_38.impl.super_TupleElement<1U,_kj::Own<kj::WebSocket>_>.value.ptr != (WebSocket *)0x0) {
    local_38.impl.super_TupleElement<1U,_kj::Own<kj::WebSocket>_>.value.ptr = (WebSocket *)0x0;
    (**(local_38.impl.super_TupleElement<1U,_kj::Own<kj::WebSocket>_>.value.disposer)->
       _vptr_Disposer)(local_38.impl.super_TupleElement<1U,_kj::Own<kj::WebSocket>_>.value.disposer,
                       pWVar1->_vptr_WebSocket[-2] + (long)&pWVar1->_vptr_WebSocket);
    pAVar4 = extraout_RDX;
  }
  pWVar1 = local_38.impl.super_TupleElement<0U,_kj::Own<kj::WebSocket>_>.value.ptr;
  if (local_38.impl.super_TupleElement<0U,_kj::Own<kj::WebSocket>_>.value.ptr != (WebSocket *)0x0) {
    local_38.impl.super_TupleElement<0U,_kj::Own<kj::WebSocket>_>.value.ptr = (WebSocket *)0x0;
    (**(local_38.impl.super_TupleElement<0U,_kj::Own<kj::WebSocket>_>.value.disposer)->
       _vptr_Disposer)(local_38.impl.super_TupleElement<0U,_kj::Own<kj::WebSocket>_>.value.disposer,
                       pWVar1->_vptr_WebSocket[-2] + (long)&pWVar1->_vptr_WebSocket);
    pAVar4 = extraout_RDX_00;
  }
  PVar6.super_PromiseBase.node.ptr = (PromiseNode *)pAVar4;
  PVar6.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar6.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}